

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::IsImportedSharedLibWithoutSOName(cmGeneratorTarget *this,string *config)

{
  ImportInfo *pIVar1;
  
  if (((this->Target->IsImportedTarget == true) && (this->Target->TargetTypeValue == SHARED_LIBRARY)
      ) && (pIVar1 = GetImportInfo(this,config), pIVar1 != (ImportInfo *)0x0)) {
    return pIVar1->NoSOName;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsImportedSharedLibWithoutSOName(
  const std::string& config) const
{
  if (this->IsImported() && this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->NoSOName;
    }
  }
  return false;
}